

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_variable * __thiscall pugi::xpath_variable_set::find(xpath_variable_set *this,char_t *name)

{
  bool bVar1;
  char *pcVar2;
  char_t *src;
  uint uVar3;
  char cVar4;
  xpath_variable *this_00;
  
  cVar4 = *name;
  if (cVar4 == '\0') {
    uVar3 = 0;
  }
  else {
    pcVar2 = name + 1;
    uVar3 = 0;
    do {
      uVar3 = ((int)cVar4 + uVar3) * 0x401;
      uVar3 = uVar3 >> 6 ^ uVar3;
      cVar4 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar4 != '\0');
    uVar3 = uVar3 * 9;
  }
  this_00 = this->_data[(uVar3 >> 0xb ^ uVar3) & 0x3f];
  while( true ) {
    if (this_00 == (xpath_variable *)0x0) {
      return (xpath_variable *)0x0;
    }
    src = xpath_variable::name(this_00);
    bVar1 = impl::anon_unknown_0::strequal(src,name);
    if (bVar1) break;
    this_00 = this_00->_next;
  }
  return this_00;
}

Assistant:

PUGI__FN xpath_variable* xpath_variable_set::find(const char_t* name) const
	{
		const size_t hash_size = sizeof(_data) / sizeof(_data[0]);
		size_t hash = impl::hash_string(name) % hash_size;

		// look for existing variable
		for (xpath_variable* var = _data[hash]; var; var = var->_next)
			if (impl::strequal(var->name(), name))
				return var;

		return 0;
	}